

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

bool __thiscall camp::Property::readable(Property *this,UserObject *object)

{
  element_type *peVar1;
  undefined1 uVar2;
  int iVar3;
  
  iVar3 = (*(this->super_TagHolder)._vptr_TagHolder[5])();
  if ((char)iVar3 == '\0') {
    uVar2 = 0;
  }
  else {
    peVar1 = (this->m_readable).m_getter.
             super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      uVar2 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,object);
      return (bool)uVar2;
    }
    uVar2 = (this->m_readable).m_defaultValue;
  }
  return (bool)uVar2;
}

Assistant:

bool Property::readable(const UserObject& object) const
{
    return isReadable() && m_readable.get(object);
}